

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O2

csc * csc_to_triu(csc *M)

{
  c_int *pcVar1;
  long lVar2;
  csc *T;
  long lVar3;
  csc *pcVar4;
  long lVar5;
  long nzmax;
  c_int cVar6;
  char *__format;
  long m;
  
  m = M->m;
  if (m == M->n) {
    nzmax = M->p[m] + m;
    T = csc_spalloc(m,m,nzmax,1,1);
    if (T != (csc *)0x0) {
      if (m < 1) {
        m = 0;
      }
      lVar5 = 0;
      lVar2 = 0;
      while (lVar3 = lVar2, lVar3 != m) {
        pcVar1 = M->p;
        for (cVar6 = pcVar1[lVar3]; lVar2 = lVar3 + 1, cVar6 < pcVar1[lVar3 + 1]; cVar6 = cVar6 + 1)
        {
          if (M->i[cVar6] <= lVar3) {
            T->i[lVar5] = M->i[cVar6];
            T->p[lVar5] = lVar3;
            T->x[lVar5] = M->x[cVar6];
            lVar5 = lVar5 + 1;
          }
        }
      }
      T->nz = lVar5;
      pcVar4 = triplet_to_csc(T,(c_int *)0x0);
      pcVar4->nzmax = nzmax;
      csc_spfree(T);
      return pcVar4;
    }
    printf("ERROR in %s: ","csc_to_triu");
    __format = "Upper triangular matrix extraction failed (out of memory)";
  }
  else {
    printf("ERROR in %s: ","csc_to_triu");
    __format = "Matrix M not square";
  }
  printf(__format);
  putchar(10);
  return (csc *)0x0;
}

Assistant:

csc* csc_to_triu(csc *M) {
  csc  *M_trip;    // Matrix in triplet format
  csc  *M_triu;    // Resulting upper triangular matrix
  c_int nnzorigM;  // Number of nonzeros from original matrix M
  c_int nnzmaxM;   // Estimated maximum number of elements of upper triangular M
  c_int n;         // Dimension of M
  c_int ptr, i, j; // Counters for (i,j) and index in M
  c_int z_M = 0;   // Counter for elements in M_trip


  // Check if matrix is square
  if (M->m != M->n) {
#ifdef PRINTING
    c_eprint("Matrix M not square");
#endif /* ifdef PRINTING */
    return OSQP_NULL;
  }
  n = M->n;

  // Get number of nonzeros full M
  nnzorigM = M->p[n];

  // Estimate nnzmaxM
  // Number of nonzero elements in original M + diagonal part.
  // -> Full matrix M as input: estimate is half the number of total elements +
  // diagonal = .5 * (nnzorigM + n)
  // -> Upper triangular matrix M as input: estimate is the number of total
  // elements + diagonal = nnzorigM + n
  // The maximum between the two is nnzorigM + n
  nnzmaxM = nnzorigM + n;

  // OLD
  // nnzmaxM = n*(n+1)/2;  // Full upper triangular matrix (This version
  // allocates too much memory!)
  // nnzmaxM = .5 * (nnzorigM + n);  // half of the total elements + diagonal

  // Allocate M_trip
  M_trip = csc_spalloc(n, n, nnzmaxM, 1, 1); // Triplet format

  if (!M_trip) {
#ifdef PRINTING
    c_eprint("Upper triangular matrix extraction failed (out of memory)");
#endif /* ifdef PRINTING */
    return OSQP_NULL;
  }

  // Fill M_trip with only elements in M which are in the upper triangular
  for (j = 0; j < n; j++) { // Cycle over columns
    for (ptr = M->p[j]; ptr < M->p[j + 1]; ptr++) {
      // Get row index
      i = M->i[ptr];

      // Assign element only if in the upper triangular
      if (i <= j) {
        // c_print("\nM(%i, %i) = %.4f", M->i[ptr], j, M->x[ptr]);

        M_trip->i[z_M] = i;
        M_trip->p[z_M] = j;
        M_trip->x[z_M] = M->x[ptr];

        // Increase counter for the number of elements
        z_M++;
      }
    }
  }

  // Set number of nonzeros
  M_trip->nz = z_M;

  // Convert triplet matrix to csc format
  M_triu = triplet_to_csc(M_trip, OSQP_NULL);

  // Assign number of nonzeros of full matrix to triu M
  M_triu->nzmax = nnzmaxM;

  // Cleanup and return result
  csc_spfree(M_trip);

  // Return matrix in triplet form
  return M_triu;
}